

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

void LoadFunction(LoadState *S,Proto *f,TString *psource)

{
  byte bVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  uint uVar4;
  TString *pTVar5;
  Instruction *b;
  TValue *pTVar6;
  Upvaldesc *pUVar7;
  Proto **ppPVar8;
  long lVar9;
  Proto *pPVar10;
  int *b_00;
  LocVar *pLVar11;
  ulong uVar12;
  char *__assertion;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 in_ZMM5 [64];
  int x;
  uint local_40;
  undefined4 uStack_3c;
  size_t local_38;
  
  auVar22 = in_ZMM5._0_32_;
  pTVar5 = LoadString(S);
  if (pTVar5 != (TString *)0x0) {
    psource = pTVar5;
  }
  f->source = psource;
  LoadBlock(S,&local_40,4);
  f->linedefined = local_40;
  LoadBlock(S,&local_40,4);
  f->lastlinedefined = local_40;
  LoadBlock(S,&local_40,1);
  f->numparams = (lu_byte)local_40;
  LoadBlock(S,&local_40,1);
  f->is_vararg = (lu_byte)local_40;
  LoadBlock(S,&local_40,1);
  f->maxstacksize = (lu_byte)local_40;
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar13 = (long)(int)local_40;
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,lVar13 << 2);
  f->code = b;
  f->sizecode = uVar4;
  LoadBlock(S,b,lVar13 << 2);
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar13 = (long)(int)local_40;
  local_38 = lVar13 << 4;
  pTVar6 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,local_38);
  f->k = pTVar6;
  f->sizek = uVar4;
  if (0 < lVar13) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(0x20));
    lVar13 = 0;
    auVar21 = vpbroadcastq_avx512f();
    do {
      uVar12 = vpcmpuq_avx512f(auVar19,auVar21,2);
      if ((uVar12 & 1) != 0) {
        *(undefined2 *)((long)&pTVar6->tt_ + lVar13) = 0;
      }
      if ((uVar12 & 2) != 0) {
        *(undefined2 *)((long)&pTVar6[1].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 4) != 0) {
        *(undefined2 *)((long)&pTVar6[2].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 8) != 0) {
        *(undefined2 *)((long)&pTVar6[3].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x10) != 0) {
        *(undefined2 *)((long)&pTVar6[4].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x20) != 0) {
        *(undefined2 *)((long)&pTVar6[5].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x40) != 0) {
        *(undefined2 *)((long)&pTVar6[6].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x80) != 0) {
        *(undefined2 *)((long)&pTVar6[7].tt_ + lVar13) = 0;
      }
      uVar12 = vpcmpuq_avx512f(auVar18,auVar21,2);
      if ((uVar12 & 1) != 0) {
        *(undefined2 *)((long)&pTVar6[8].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 2) != 0) {
        *(undefined2 *)((long)&pTVar6[9].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 4) != 0) {
        *(undefined2 *)((long)&pTVar6[10].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 8) != 0) {
        *(undefined2 *)((long)&pTVar6[0xb].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x10) != 0) {
        *(undefined2 *)((long)&pTVar6[0xc].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x20) != 0) {
        *(undefined2 *)((long)&pTVar6[0xd].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x40) != 0) {
        *(undefined2 *)((long)&pTVar6[0xe].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x80) != 0) {
        *(undefined2 *)((long)&pTVar6[0xf].tt_ + lVar13) = 0;
      }
      uVar12 = vpcmpuq_avx512f(auVar17,auVar21,2);
      if ((uVar12 & 1) != 0) {
        *(undefined2 *)((long)&pTVar6[0x10].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 2) != 0) {
        *(undefined2 *)((long)&pTVar6[0x11].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 4) != 0) {
        *(undefined2 *)((long)&pTVar6[0x12].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 8) != 0) {
        *(undefined2 *)((long)&pTVar6[0x13].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x10) != 0) {
        *(undefined2 *)((long)&pTVar6[0x14].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x20) != 0) {
        *(undefined2 *)((long)&pTVar6[0x15].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x40) != 0) {
        *(undefined2 *)((long)&pTVar6[0x16].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x80) != 0) {
        *(undefined2 *)((long)&pTVar6[0x17].tt_ + lVar13) = 0;
      }
      uVar12 = vpcmpuq_avx512f(auVar16,auVar21,2);
      if ((uVar12 & 1) != 0) {
        *(undefined2 *)((long)&pTVar6[0x18].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 2) != 0) {
        *(undefined2 *)((long)&pTVar6[0x19].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 4) != 0) {
        *(undefined2 *)((long)&pTVar6[0x1a].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 8) != 0) {
        *(undefined2 *)((long)&pTVar6[0x1b].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x10) != 0) {
        *(undefined2 *)((long)&pTVar6[0x1c].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x20) != 0) {
        *(undefined2 *)((long)&pTVar6[0x1d].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x40) != 0) {
        *(undefined2 *)((long)&pTVar6[0x1e].tt_ + lVar13) = 0;
      }
      if ((uVar12 & 0x80) != 0) {
        *(undefined2 *)((long)&pTVar6[0x1f].tt_ + lVar13) = 0;
      }
      auVar19 = vpaddq_avx512f(auVar19,auVar20);
      auVar18 = vpaddq_avx512f(auVar18,auVar20);
      auVar17 = vpaddq_avx512f(auVar17,auVar20);
      auVar16 = vpaddq_avx512f(auVar16,auVar20);
      lVar13 = lVar13 + 0x200;
    } while ((ulong)(uVar4 + 0x1f >> 5) << 9 != lVar13);
    sVar14 = 0;
    do {
      pTVar6 = f->k;
      auVar20 = ZEXT1664(auVar20._0_16_);
      LoadBlock(S,&local_40,1);
      switch((lu_byte)local_40) {
      case '\0':
        uVar3 = 0;
        break;
      case '\x01':
        LoadBlock(S,&local_40,1);
        *(uint *)((long)&pTVar6->value_ + sVar14) = local_40 & 0xff;
        uVar3 = 1;
        break;
      case '\x02':
switchD_00125090_caseD_2:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                      ,0x97,"void LoadConstants(LoadState *, Proto *)");
      case '\x03':
        LoadBlock(S,&local_40,8);
        uVar3 = 3;
        *(ulong *)((long)&pTVar6->value_ + sVar14) = CONCAT44(uStack_3c,local_40);
        break;
      case '\x04':
switchD_00125090_caseD_4:
        pTVar5 = LoadString(S);
        if (9 < (pTVar5->tt & 0xe)) {
          __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_00125530:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                        ,0x94,"void LoadConstants(LoadState *, Proto *)");
        }
        *(TString **)((long)&pTVar6->value_ + sVar14) = pTVar5;
        bVar1 = pTVar5->tt;
        *(ushort *)((long)&pTVar6->tt_ + sVar14) = bVar1 | 0x8000;
        if (((char)bVar1 < '\0') ||
           ((S->L != (lua_State *)0x0 && ((pTVar5->marked & (S->L->l_G->currentwhite ^ 0x18)) != 0))
           )) {
          __assertion = "0";
          goto LAB_00125530;
        }
        goto LAB_00125160;
      default:
        if ((local_40 & 0xff) != 0x13) {
          if ((local_40 & 0xff) != 0x14) goto switchD_00125090_caseD_2;
          goto switchD_00125090_caseD_4;
        }
        LoadBlock(S,&local_40,8);
        *(ulong *)((long)&pTVar6->value_ + sVar14) = CONCAT44(uStack_3c,local_40);
        uVar3 = 0x13;
      }
      *(undefined2 *)((long)&pTVar6->tt_ + sVar14) = uVar3;
LAB_00125160:
      auVar22 = auVar20._0_32_;
      sVar14 = sVar14 + 0x10;
    } while (local_38 != sVar14);
  }
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar13 = (long)(int)local_40;
  sVar14 = lVar13 * 0x18;
  pUVar7 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,sVar14);
  f->upvalues = pUVar7;
  f->sizeupvalues = uVar4;
  if (0 < lVar13) {
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar17 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar19 = vpbroadcastq_avx512f();
    auVar22 = vpcmpeqd_avx2(auVar22,auVar22);
    uVar12 = (ulong)(uVar4 + 7 & 0xfffffff8);
    auVar20 = vpbroadcastq_avx512f();
    do {
      auVar21 = vpmullq_avx512dq(auVar16,auVar17);
      uVar2 = vpcmpuq_avx512f(auVar16,auVar20,2);
      auVar16 = vpaddq_avx512f(auVar16,auVar18);
      uVar12 = uVar12 - 8;
      vpscatterqq_avx512f(ZEXT864(pUVar7) + auVar21,uVar2,ZEXT1664((undefined1  [16])0x0));
      auVar21 = vpaddq_avx512f(auVar19,auVar21);
      vpscatterqd_avx512f(ZEXT832(0x10) + auVar21._0_32_,uVar2,auVar22);
      vpscatterqq_avx512f(ZEXT864(8) + auVar21,uVar2,ZEXT1664((undefined1  [16])0x0));
    } while (uVar12 != 0);
    sVar15 = 0;
    do {
      LoadBlock(S,&local_40,1);
      (&f->upvalues->instack)[sVar15] = (lu_byte)local_40;
      LoadBlock(S,&local_40,1);
      (&f->upvalues->idx)[sVar15] = (lu_byte)local_40;
      sVar15 = sVar15 + 0x18;
    } while (sVar14 != sVar15);
  }
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar13 = (long)(int)local_40;
  ppPVar8 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,lVar13 * 8);
  f->p = ppPVar8;
  f->sizep = uVar4;
  if (0 < lVar13) {
    lVar9 = 0;
    do {
      f->p[lVar9] = (Proto *)0x0;
      lVar9 = lVar9 + 1;
    } while (lVar13 != lVar9);
    if (0 < (int)uVar4) {
      lVar9 = 0;
      do {
        pPVar10 = luaF_newproto(S->L);
        f->p[lVar9] = pPVar10;
        LoadFunction(S,f->p[lVar9],f->source);
        lVar9 = lVar9 + 1;
      } while (lVar13 != lVar9);
    }
  }
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar13 = (long)(int)local_40;
  b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,lVar13 << 2);
  f->lineinfo = b_00;
  f->sizelineinfo = uVar4;
  LoadBlock(S,b_00,lVar13 << 2);
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar13 = (long)(int)local_40;
  sVar14 = lVar13 << 5;
  pLVar11 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,sVar14);
  f->locvars = pLVar11;
  f->sizelocvars = uVar4;
  if (0 < lVar13) {
    sVar15 = 0;
    do {
      *(undefined1 (*) [16])((long)&pLVar11->varname + sVar15) = (undefined1  [16])0x0;
      sVar15 = sVar15 + 0x20;
    } while (sVar14 != sVar15);
    sVar15 = 0;
    do {
      pTVar5 = LoadString(S);
      *(TString **)((long)&f->locvars->varname + sVar15) = pTVar5;
      LoadBlock(S,&local_40,4);
      *(uint *)((long)&f->locvars->startpc + sVar15) = local_40;
      LoadBlock(S,&local_40,4);
      *(uint *)((long)&f->locvars->endpc + sVar15) = local_40;
      if (S->version == '\0') {
        LoadBlock(S,&local_40,1);
        uVar4 = 0xffffffff;
        if ((byte)((lu_byte)local_40 - 1) < 10) {
          uVar4 = *(uint *)(&DAT_00157f54 + (ulong)(byte)((lu_byte)local_40 - 1) * 4);
        }
      }
      else {
        LoadBlock(S,&local_40,4);
        uVar4 = local_40;
      }
      *(uint *)((long)&f->locvars->ravi_type_map + sVar15) = uVar4;
      pTVar5 = LoadString(S);
      *(TString **)((long)&f->locvars->usertype + sVar15) = pTVar5;
      sVar15 = sVar15 + 0x20;
    } while (sVar14 != sVar15);
  }
  LoadBlock(S,&local_40,4);
  lVar13 = (long)(int)local_40;
  if (0 < lVar13) {
    lVar9 = 0;
    do {
      pTVar5 = LoadString(S);
      *(TString **)((long)&f->upvalues->name + lVar9) = pTVar5;
      if (S->version == '\0') {
        LoadBlock(S,&local_40,1);
        uVar4 = 0xffffffff;
        if ((byte)((lu_byte)local_40 - 1) < 10) {
          uVar4 = *(uint *)(&DAT_00157f54 + (ulong)(byte)((lu_byte)local_40 - 1) * 4);
        }
      }
      else {
        LoadBlock(S,&local_40,4);
        uVar4 = local_40;
      }
      *(uint *)((long)&f->upvalues->ravi_type_map + lVar9) = uVar4;
      pTVar5 = LoadString(S);
      *(TString **)((long)&f->upvalues->usertype + lVar9) = pTVar5;
      lVar9 = lVar9 + 0x18;
    } while (lVar13 * 0x18 != lVar9);
  }
  return;
}

Assistant:

static void LoadFunction (LoadState *S, Proto *f, TString *psource) {
  f->source = LoadString(S);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = LoadInt(S);
  f->lastlinedefined = LoadInt(S);
  f->numparams = LoadByte(S);
  f->is_vararg = LoadByte(S);
  f->maxstacksize = LoadByte(S);
  LoadCode(S, f);
  LoadConstants(S, f);
  LoadUpvalues(S, f);
  LoadProtos(S, f);
  LoadDebug(S, f);
}